

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O1

void __thiscall
amrex::MFIter::MFIter(MFIter *this,BoxArray *ba,DistributionMapping *dm,MFItInfo *info)

{
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> this_00;
  pointer *__ptr;
  
  this_00._M_head_impl = (FabArrayBase *)operator_new(0xf0);
  FabArrayBase::FabArrayBase(this_00._M_head_impl,ba,dm,1,0);
  (this->m_fa)._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl = this_00._M_head_impl;
  this->fabArray = this_00._M_head_impl;
  *(undefined8 *)(this->tile_size).vect = *(undefined8 *)(info->tilesize).vect;
  (this->tile_size).vect[2] = (info->tilesize).vect[2];
  this->flags = info->do_tiling;
  this->streams = info->num_streams;
  (this->typ).itype = 0;
  this->dynamic = false;
  (this->device_sync).flag = info->device_sync;
  this->index_map = (Vector<int,_std::allocator<int>_> *)0x0;
  this->local_index_map = (Vector<int,_std::allocator<int>_> *)0x0;
  this->tile_array = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x0;
  this->local_tile_index_map = (Vector<int,_std::allocator<int>_> *)0x0;
  this->num_local_tiles = (Vector<int,_std::allocator<int>_> *)0x0;
  FabArrayBase::addThisBD(this_00._M_head_impl);
  Initialize(this);
  return;
}

Assistant:

MFIter::MFIter (const BoxArray& ba, const DistributionMapping& dm, const MFItInfo& info)
    :
    m_fa(std::make_unique<FabArrayBase>(ba, dm, 1, 0)),
    fabArray(*m_fa),
    tile_size(info.tilesize),
    flags(info.do_tiling ? Tiling : 0),
    streams(info.num_streams),
    dynamic(info.dynamic && (OpenMP::get_num_threads() > 1)),
    device_sync(info.device_sync),
    index_map(nullptr),
    local_index_map(nullptr),
    tile_array(nullptr),
    local_tile_index_map(nullptr),
    num_local_tiles(nullptr)
{
#ifdef AMREX_USE_OMP
#pragma omp single
#endif
    {
        m_fa->addThisBD();
    }
#ifdef AMREX_USE_OMP
    if (dynamic) {
#pragma omp barrier
#pragma omp single
        nextDynamicIndex = omp_get_num_threads();
        // yes omp single has an implicit barrier and we need it because nextDynamicIndex is static.
    }
#endif

    Initialize();
}